

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

char * sha1_Data(sha2_byte *data,size_t len,char *digest)

{
  char *pcVar1;
  undefined1 local_80 [8];
  SHA1_CTX context;
  char *digest_local;
  size_t len_local;
  sha2_byte *data_local;
  
  context.buffer._56_8_ = digest;
  sha1_Init((SHA1_CTX *)local_80);
  sha1_Update((SHA1_CTX *)local_80,data,len);
  pcVar1 = sha1_End((SHA1_CTX *)local_80,(char *)context.buffer._56_8_);
  return pcVar1;
}

Assistant:

char* sha1_Data(const sha2_byte* data, size_t len, char digest[SHA1_DIGEST_STRING_LENGTH]) {
    trezor::SHA1_CTX	context;

	sha1_Init(&context);
	sha1_Update(&context, data, len);
	return sha1_End(&context, digest);
}